

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_extended_test.cc
# Opt level: O1

void run_tests_with_encryption(fdb_encryption_algorithm_t encryption)

{
  fdb_status fVar1;
  int iVar2;
  pointer __s;
  char *__format;
  int i;
  long lVar3;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  pthread_t tid;
  vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> docs;
  void *thread_ret;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info local_188;
  compactor_thread_args args;
  fdb_config fconfig;
  
  fprintf(_stderr,"----testing with encryption algorithm %d\n",encryption);
  cur_encryption = encryption;
  test_multi_readers(MULTI_READERS,"test multi readers");
  test_multi_readers(MULTI_SNAPSHOT_READERS,"test multi snapshot readers");
  test_multi_readers(MULTI_MIXED_READERS,"test multi mixed readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_READERS,MANUAL_COMPACTION,"test a single writer and multi readers"
            );
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_SNAPSHOT_READERS,MANUAL_COMPACTION,
             "test a single writer and multi snapshot readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_MIXED_READERS,MANUAL_COMPACTION,
             "test a single writer and multi mixed readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_READERS,DAEMON_COMPACTION,
             "test a single writer, a compaction daemon, and multi readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_SNAPSHOT_READERS,DAEMON_COMPACTION,
             "test a single writer, a compaction daemon, and multi snapshot readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_MIXED_READERS,DAEMON_COMPACTION,
             "test a single writer, a compaction daemon, and multi mixed readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_READERS,MANUAL_COMPACTION,
             "test a transactional writer and multi readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_SNAPSHOT_READERS,MANUAL_COMPACTION,
             "test a transactional writer and multi snapshot readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_MIXED_READERS,MANUAL_COMPACTION,
             "test a transactional writer and multi mixed readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_READERS,DAEMON_COMPACTION,
             "test a transactional writer, a compaction daemon, and multi readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_SNAPSHOT_READERS,DAEMON_COMPACTION,
             "test a transactional writer, a compaction daemon, and multi snapshot readers");
  iVar2 = 0x1412fb;
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_MIXED_READERS,DAEMON_COMPACTION,
             "test a transactional writer, a compaction daemon, and multi mixed readers");
  test_rollback_multi_readers(MULTI_READERS,"test a rollback and multi readers");
  test_rollback_multi_readers(MULTI_SNAPSHOT_READERS,"test a rollback and multi snapshot readers");
  test_rollback_multi_readers(MULTI_MIXED_READERS,"test a rollback and multi mixed readers");
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  test.fdb* > errorlog.txt");
  rollback_done = false;
  fdb_get_default_config();
  fconfig.seqtree_opt = '\x01';
  fconfig.encryption_key.algorithm = cur_encryption;
  _set_random_string((char *)fconfig.encryption_key.bytes,0x20);
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&dbfile,test_filename,&fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x319);
    test_rollback_compaction(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,0x319,"void test_rollback_compaction(const char *)");
  }
  fVar1 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x31b);
    test_rollback_compaction(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,0x31b,"void test_rollback_compaction(const char *)");
  }
  fVar1 = fdb_set_log_callback(db,logCallbackFunc,"rollback_compactor_thread");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,799);
    test_rollback_compaction(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,799,"void test_rollback_compaction(const char *)");
  }
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(800000);
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_finish = __s;
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 100000;
  memset(__s,0,800000);
  docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 100000;
  loadDocsWithRandomKeys(dbfile,db,&docs,iVar2);
  updateDocsWithRandomKeys(dbfile,db,&docs,0,50000);
  updateDocsWithRandomKeys(dbfile,db,&docs,50000,100000);
  args.config = &fconfig;
  args.kvs_config = &kvs_config;
  pthread_create(&tid,(pthread_attr_t *)0x0,_compactor_thread,&args);
  usleep(10000);
  fVar1 = fdb_rollback(&db,150000);
  if (fVar1 == FDB_RESULT_NO_DB_INSTANCE) {
    fdb_get_file_info(dbfile,&local_188);
    iVar2 = strcmp(local_188.filename,test_filename);
    if (iVar2 == 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
              ,0x33f);
      test_rollback_compaction(char_const*)::__test_pass = '\x01';
      iVar2 = strcmp(local_188.filename,test_filename);
      if (iVar2 == 0) {
        __assert_fail("strcmp(info.filename, test_filename)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                      ,0x33f,"void test_rollback_compaction(const char *)");
      }
    }
  }
  else if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x339);
    test_rollback_compaction(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_NO_DB_INSTANCE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,0x339,"void test_rollback_compaction(const char *)");
  }
  fVar1 = fdb_kvs_close(db);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_close(dbfile);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pthread_join(tid,&thread_ret);
      lVar3 = 0;
      do {
        fdb_doc_free(__s[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 100000);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (test_rollback_compaction(char_const*)::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"test concurrent rollback and compaction");
      operator_delete(__s);
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
            ,0x345);
    test_rollback_compaction(char_const*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                  ,0x345,"void test_rollback_compaction(const char *)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
          ,0x343);
  test_rollback_compaction(char_const*)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_extended_test.cc"
                ,0x343,"void test_rollback_compaction(const char *)");
}

Assistant:

void run_tests_with_encryption(fdb_encryption_algorithm_t encryption) {
    fprintf(stderr, "----testing with encryption algorithm %d\n", encryption);
    cur_encryption = encryption;

    // Read-only with multiple readers.
    test_multi_readers(MULTI_READERS, "test multi readers");
    test_multi_readers(MULTI_SNAPSHOT_READERS, "test multi snapshot readers");
    test_multi_readers(MULTI_MIXED_READERS, "test multi mixed readers");

    // Execute a writer with a manual compaction and multiple readers together.
    test_writer_multi_readers(REGULAR_WRITER, MULTI_READERS, MANUAL_COMPACTION,
                              "test a single writer and multi readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_SNAPSHOT_READERS,
                              MANUAL_COMPACTION,
                              "test a single writer and multi snapshot readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_MIXED_READERS,
                              MANUAL_COMPACTION,
                              "test a single writer and multi mixed readers");

    // Execute a writer, a compaction daemon, and multiple readers together.
    test_writer_multi_readers(REGULAR_WRITER, MULTI_READERS, DAEMON_COMPACTION,
                              "test a single writer, a compaction daemon, "
                              "and multi readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_SNAPSHOT_READERS,
                              DAEMON_COMPACTION,
                              "test a single writer, a compaction daemon, "
                              "and multi snapshot readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_MIXED_READERS,
                              DAEMON_COMPACTION,
                              "test a single writer, a compaction daemon, "
                              "and multi mixed readers");

    // Execute a transactional writer with a manual compaction and
    // multiple readers together.
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_READERS,
                              MANUAL_COMPACTION,
                              "test a transactional writer and "
                              "multi readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_SNAPSHOT_READERS,
                              MANUAL_COMPACTION,
                              "test a transactional writer and "
                              "multi snapshot readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_MIXED_READERS,
                              MANUAL_COMPACTION,
                              "test a transactional writer and "
                              "multi mixed readers");

    // Execute a transactional writer, a compaction daemon, and
    // multiple readers together.
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_READERS,
                              DAEMON_COMPACTION,
                              "test a transactional writer, a compaction daemon, "
                              "and multi readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_SNAPSHOT_READERS,
                              DAEMON_COMPACTION,
                              "test a transactional writer, a compaction daemon, "
                              "and multi snapshot readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_MIXED_READERS,
                              DAEMON_COMPACTION,
                              "test a transactional writer, a compaction daemon, "
                              "and multi mixed readers");

    // Execute a rollback and multiple readers together.
    test_rollback_multi_readers(MULTI_READERS, "test a rollback and multi readers");
    test_rollback_multi_readers(MULTI_SNAPSHOT_READERS,
                                "test a rollback and multi snapshot readers");
    test_rollback_multi_readers(MULTI_MIXED_READERS,
                                "test a rollback and multi mixed readers");
    test_rollback_compaction("test concurrent rollback and compaction");
}